

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NodePrintFactor(FILE *pFile,Abc_Obj_t *pNode,int fUseRealNames)

{
  char **pNamesIn;
  FILE *pFVar1;
  int iVar2;
  Dec_Graph_t *pGraph_00;
  Vec_Ptr_t *vNames;
  char *pcVar3;
  Vec_Ptr_t *vNamesIn;
  Dec_Graph_t *pGraph;
  Abc_Obj_t *pAStack_18;
  int fUseRealNames_local;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  iVar2 = Abc_ObjIsCo(pNode);
  pAStack_18 = pNode;
  if (iVar2 != 0) {
    pAStack_18 = Abc_ObjFanin0(pNode);
  }
  iVar2 = Abc_ObjIsPi(pAStack_18);
  if (iVar2 == 0) {
    iVar2 = Abc_ObjIsLatch(pAStack_18);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjIsNode(pAStack_18);
      if (iVar2 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPrint.c"
                      ,0x456,"void Abc_NodePrintFactor(FILE *, Abc_Obj_t *, int)");
      }
      pGraph_00 = Dec_Factor((char *)(pAStack_18->field_5).pData);
      pFVar1 = _stdout;
      if (fUseRealNames == 0) {
        pcVar3 = Abc_ObjName(pAStack_18);
        Dec_GraphPrint(pFVar1,pGraph_00,(char **)0x0,pcVar3);
      }
      else {
        vNames = Abc_NodeGetFaninNames(pAStack_18);
        pFVar1 = _stdout;
        pNamesIn = (char **)vNames->pArray;
        pcVar3 = Abc_ObjName(pAStack_18);
        Dec_GraphPrint(pFVar1,pGraph_00,pNamesIn,pcVar3);
        Abc_NodeFreeNames(vNames);
      }
      Dec_GraphFree(pGraph_00);
    }
    else {
      fprintf((FILE *)pFile,"Skipping the latch.\n");
    }
  }
  else {
    fprintf((FILE *)pFile,"Skipping the PI node.\n");
  }
  return;
}

Assistant:

void Abc_NodePrintFactor( FILE * pFile, Abc_Obj_t * pNode, int fUseRealNames )
{
    Dec_Graph_t * pGraph;
    Vec_Ptr_t * vNamesIn;
    if ( Abc_ObjIsCo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
    {
        fprintf( pFile, "Skipping the PI node.\n" );
        return;
    }
    if ( Abc_ObjIsLatch(pNode) )
    {
        fprintf( pFile, "Skipping the latch.\n" );
        return;
    }
    assert( Abc_ObjIsNode(pNode) );
    pGraph = Dec_Factor( (char *)pNode->pData );
    if ( fUseRealNames )
    {
        vNamesIn = Abc_NodeGetFaninNames(pNode);
        Dec_GraphPrint( stdout, pGraph, (char **)vNamesIn->pArray, Abc_ObjName(pNode) );
        Abc_NodeFreeNames( vNamesIn );
    }
    else
        Dec_GraphPrint( stdout, pGraph, (char **)NULL, Abc_ObjName(pNode) );
    Dec_GraphFree( pGraph );
}